

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_dead_code_elimination.cpp
# Opt level: O3

void __thiscall
optimization::complex_dce::ComplexDceRunner::calc_remained_vars(ComplexDceRunner *this)

{
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *this_00;
  VarId *pVVar1;
  _Hash_node_base *p_Var2;
  _Elt_pointer pVVar3;
  _Map_pointer ppVVar4;
  _Map_pointer ppVVar5;
  _Map_pointer ppVVar6;
  _Elt_pointer pVVar7;
  _Map_pointer ppVVar8;
  _Map_pointer ppVVar9;
  _Elt_pointer pVVar10;
  _Elt_pointer pVVar11;
  _Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true> _Var12;
  __node_base_ptr p_Var13;
  ulong uVar14;
  __hashtable *__h;
  _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true> __tmp_2;
  _Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true> __tmp;
  byte bVar15;
  pair<std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>,_std::__detail::_Node_iterator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_false,_true>_>
  pVar16;
  pair<std::__detail::_Node_iterator<mir::inst::VarId,_true,_true>,_bool> pVar17;
  pair<std::__detail::_Node_iterator<mir::inst::VarId,_true,_true>,_bool> pVar18;
  VarId x;
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  *__range3;
  unordered_set<mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
  visited;
  _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_120;
  VarId local_118;
  _Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> local_108;
  ComplexDceRunner *local_b0;
  _Elt_pointer local_a8;
  _Elt_pointer pVStack_a0;
  _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_90;
  _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_88;
  _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_80;
  _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_78;
  _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
  *local_70;
  _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_108._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_108._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::_M_initialize_map
            (&local_108,0);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_90 = &(this->ref_vars)._M_h;
  local_70 = &(this->invert_dependance)._M_h;
  local_78 = &(this->store_dependance)._M_h;
  this_00 = &this->do_not_delete;
  local_80 = &(this->var_dependance)._M_h;
  local_88 = &(this->backup_ref_vars)._M_h;
  pVVar10 = local_108._M_impl.super__Deque_impl_data._M_start._M_first;
  pVVar11 = local_108._M_impl.super__Deque_impl_data._M_start._M_last;
  pVVar3 = local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
  ppVVar4 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVVar5 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
  ppVVar6 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
  local_b0 = this;
  do {
    for (; pVStack_a0 = pVVar11, local_a8 = pVVar10,
        ppVVar9 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node,
        ppVVar8 = local_108._M_impl.super__Deque_impl_data._M_start._M_node,
        pVVar7 = local_108._M_impl.super__Deque_impl_data._M_start._M_cur,
        ppVVar4 < local_108._M_impl.super__Deque_impl_data._M_finish._M_node; ppVVar4 = ppVVar4 + 1)
    {
      local_108._M_impl.super__Deque_impl_data._M_start._M_cur = pVVar3;
      local_108._M_impl.super__Deque_impl_data._M_start._M_node = ppVVar5;
      local_108._M_impl.super__Deque_impl_data._M_finish._M_node = ppVVar6;
      operator_delete(ppVVar4[1],0x200);
      pVVar10 = local_a8;
      pVVar11 = pVStack_a0;
      pVVar3 = local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVVar5 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
      ppVVar6 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
      local_108._M_impl.super__Deque_impl_data._M_finish._M_node = ppVVar9;
      local_108._M_impl.super__Deque_impl_data._M_start._M_node = ppVVar8;
      local_108._M_impl.super__Deque_impl_data._M_start._M_cur = pVVar7;
    }
    local_108._M_impl.super__Deque_impl_data._M_finish._M_first = local_a8;
    local_108._M_impl.super__Deque_impl_data._M_finish._M_last = pVStack_a0;
    local_108._M_impl.super__Deque_impl_data._M_finish._M_node =
         local_108._M_impl.super__Deque_impl_data._M_start._M_node;
    local_108._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_108._M_impl.super__Deque_impl_data._M_start._M_cur = pVVar3;
    local_108._M_impl.super__Deque_impl_data._M_start._M_node = ppVVar5;
    for (p_Var2 = (local_b0->ref_vars)._M_h._M_before_begin._M_nxt; p_Var2 != (_Hash_node_base *)0x0
        ; p_Var2 = p_Var2->_M_nxt) {
      local_118.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      local_118.id = *(uint32_t *)&p_Var2[2]._M_nxt;
      if (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_108._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
        _M_push_back_aux<mir::inst::VarId_const&>
                  ((deque<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)&local_108,&local_118
                  );
      }
      else {
        ((local_108._M_impl.super__Deque_impl_data._M_finish._M_cur)->super_Displayable).
        _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur)->id = local_118.id;
        local_108._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_108._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    }
    bVar15 = 0;
    pVVar10 = local_108._M_impl.super__Deque_impl_data._M_start._M_first;
    pVVar11 = local_108._M_impl.super__Deque_impl_data._M_start._M_last;
    pVVar3 = local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVVar4 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
    ppVVar5 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
    ppVVar6 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
    if (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_108._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        local_118.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        local_118.id = (local_108._M_impl.super__Deque_impl_data._M_start._M_cur)->id;
        if (local_108._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_108._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_108._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_108._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_108._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_108._M_impl.super__Deque_impl_data._M_start._M_last =
               local_108._M_impl.super__Deque_impl_data._M_start._M_cur + 0x20;
          local_108._M_impl.super__Deque_impl_data._M_start._M_first =
               local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_108._M_impl.super__Deque_impl_data._M_start._M_node =
               local_108._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_108._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_108._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        local_120 = &local_68;
        std::
        _Hashtable<mir::inst::VarId,mir::inst::VarId,std::allocator<mir::inst::VarId>,std::__detail::_Identity,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<mir::inst::VarId_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<mir::inst::VarId,true>>>>
                  ((_Hashtable<mir::inst::VarId,mir::inst::VarId,std::allocator<mir::inst::VarId>,std::__detail::_Identity,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&local_68,&local_118,&local_120);
        pVar16 = std::
                 _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 ::equal_range(local_70,&local_118);
        for (_Var12._M_cur =
                  (__node_type *)
                  pVar16.first.
                  super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                  ._M_cur;
            (_Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>)
            _Var12._M_cur !=
            pVar16.second.
            super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>.
            _M_cur.
            super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>;
            _Var12._M_cur = (__node_type *)((_Var12._M_cur)->super__Hash_node_base)._M_nxt) {
          pVVar1 = (VarId *)((long)&((_Var12._M_cur)->
                                    super__Hash_node_value<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                    ._M_storage._M_storage + 0x10);
          uVar14 = (ulong)*(uint *)((long)&((_Var12._M_cur)->
                                           super__Hash_node_value<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                           ._M_storage._M_storage + 0x18);
          p_Var13 = std::
                    _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::_M_find_before_node(&local_68,uVar14 % local_68._M_bucket_count,pVVar1,uVar14)
          ;
          if ((p_Var13 == (__node_base_ptr)0x0) || (p_Var13->_M_nxt == (_Hash_node_base *)0x0)) {
            if (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_108._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
              _M_push_back_aux<mir::inst::VarId_const&>
                        ((deque<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)&local_108,
                         pVVar1);
            }
            else {
              ((local_108._M_impl.super__Deque_impl_data._M_finish._M_cur)->super_Displayable).
              _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
              (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur)->id =
                   *(uint32_t *)
                    ((long)&((_Var12._M_cur)->
                            super__Hash_node_value<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                            ._M_storage._M_storage + 0x18);
              local_108._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_108._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
        }
        pVar16 = std::
                 _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 ::equal_range(local_78,&local_118);
        for (_Var12._M_cur =
                  (__node_type *)
                  pVar16.first.
                  super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                  ._M_cur;
            (_Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>)
            _Var12._M_cur !=
            pVar16.second.
            super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>.
            _M_cur.
            super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>;
            _Var12._M_cur = (__node_type *)((_Var12._M_cur)->super__Hash_node_base)._M_nxt) {
          local_120 = &this_00->_M_h;
          pVar17 = std::
                   _Hashtable<mir::inst::VarId,mir::inst::VarId,std::allocator<mir::inst::VarId>,std::__detail::_Identity,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<mir::inst::VarId_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<mir::inst::VarId,true>>>>
                             ((_Hashtable<mir::inst::VarId,mir::inst::VarId,std::allocator<mir::inst::VarId>,std::__detail::_Identity,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)this_00,
                              (undefined1 *)
                              ((long)&((_Var12._M_cur)->
                                      super__Hash_node_value<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                                      ).
                                      super__Hash_node_value_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                      ._M_storage._M_storage + 0x10),&local_120);
          local_120 = &this_00->_M_h;
          pVar18 = std::
                   _Hashtable<mir::inst::VarId,mir::inst::VarId,std::allocator<mir::inst::VarId>,std::__detail::_Identity,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<mir::inst::VarId_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<mir::inst::VarId,true>>>>
                             ((_Hashtable<mir::inst::VarId,mir::inst::VarId,std::allocator<mir::inst::VarId>,std::__detail::_Identity,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)this_00,&local_118,&local_120);
          bVar15 = bVar15 | pVar17.second | pVar18.second;
        }
        pVVar10 = local_108._M_impl.super__Deque_impl_data._M_start._M_first;
        pVVar11 = local_108._M_impl.super__Deque_impl_data._M_start._M_last;
        pVVar3 = local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
        ppVVar4 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
        ppVVar5 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
        ppVVar6 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
      } while (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_108._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    for (; pVStack_a0 = pVVar11, local_a8 = pVVar10,
        ppVVar9 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node,
        ppVVar8 = local_108._M_impl.super__Deque_impl_data._M_start._M_node,
        pVVar7 = local_108._M_impl.super__Deque_impl_data._M_start._M_cur,
        ppVVar4 < local_108._M_impl.super__Deque_impl_data._M_finish._M_node; ppVVar4 = ppVVar4 + 1)
    {
      local_108._M_impl.super__Deque_impl_data._M_start._M_cur = pVVar3;
      local_108._M_impl.super__Deque_impl_data._M_start._M_node = ppVVar5;
      local_108._M_impl.super__Deque_impl_data._M_finish._M_node = ppVVar6;
      operator_delete(ppVVar4[1],0x200);
      pVVar10 = local_a8;
      pVVar11 = pVStack_a0;
      pVVar3 = local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
      ppVVar5 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
      ppVVar6 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
      local_108._M_impl.super__Deque_impl_data._M_finish._M_node = ppVVar9;
      local_108._M_impl.super__Deque_impl_data._M_start._M_node = ppVVar8;
      local_108._M_impl.super__Deque_impl_data._M_start._M_cur = pVVar7;
    }
    local_108._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_108._M_impl.super__Deque_impl_data._M_finish._M_first = local_a8;
    local_108._M_impl.super__Deque_impl_data._M_finish._M_last = pVStack_a0;
    local_108._M_impl.super__Deque_impl_data._M_finish._M_node =
         local_108._M_impl.super__Deque_impl_data._M_start._M_node;
    local_108._M_impl.super__Deque_impl_data._M_start._M_cur = pVVar3;
    local_108._M_impl.super__Deque_impl_data._M_start._M_node = ppVVar5;
    for (p_Var2 = (local_b0->do_not_delete)._M_h._M_before_begin._M_nxt;
        p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
      local_118.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
      local_118.id = *(uint32_t *)&p_Var2[2]._M_nxt;
      if (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_108._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
        _M_push_back_aux<mir::inst::VarId_const&>
                  ((deque<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)&local_108,&local_118
                  );
      }
      else {
        ((local_108._M_impl.super__Deque_impl_data._M_finish._M_cur)->super_Displayable).
        _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur)->id = local_118.id;
        local_108._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_108._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
      }
    }
    if (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        local_108._M_impl.super__Deque_impl_data._M_start._M_cur) {
      do {
        local_118.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001eb100;
        local_118.id = (local_108._M_impl.super__Deque_impl_data._M_start._M_cur)->id;
        if (local_108._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_108._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_108._M_impl.super__Deque_impl_data._M_start._M_first,0x200);
          local_108._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_108._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_108._M_impl.super__Deque_impl_data._M_start._M_last =
               local_108._M_impl.super__Deque_impl_data._M_start._M_cur + 0x20;
          local_108._M_impl.super__Deque_impl_data._M_start._M_first =
               local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_108._M_impl.super__Deque_impl_data._M_start._M_node =
               local_108._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_108._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_108._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        local_120 = &this_00->_M_h;
        pVar17 = std::
                 _Hashtable<mir::inst::VarId,mir::inst::VarId,std::allocator<mir::inst::VarId>,std::__detail::_Identity,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 ::
                 _M_insert<mir::inst::VarId_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<mir::inst::VarId,true>>>>
                           ((_Hashtable<mir::inst::VarId,mir::inst::VarId,std::allocator<mir::inst::VarId>,std::__detail::_Identity,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                             *)this_00,&local_118,&local_120);
        pVar16 = std::
                 _Hashtable<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::__detail::_Select1st,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                 ::equal_range(local_80,&local_118);
        for (_Var12._M_cur =
                  (__node_type *)
                  pVar16.first.
                  super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                  ._M_cur;
            (_Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>)
            _Var12._M_cur !=
            pVar16.second.
            super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>.
            _M_cur.
            super__Node_iterator_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>;
            _Var12._M_cur = (__node_type *)((_Var12._M_cur)->super__Hash_node_base)._M_nxt) {
          pVVar1 = (VarId *)((long)&((_Var12._M_cur)->
                                    super__Hash_node_value<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                                    ).
                                    super__Hash_node_value_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                    ._M_storage._M_storage + 0x10);
          uVar14 = (ulong)*(uint *)((long)&((_Var12._M_cur)->
                                           super__Hash_node_value<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                                           ).
                                           super__Hash_node_value_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                                           ._M_storage._M_storage + 0x18);
          p_Var13 = std::
                    _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::_M_find_before_node
                              (&this_00->_M_h,
                               uVar14 % (local_b0->do_not_delete)._M_h._M_bucket_count,pVVar1,uVar14
                              );
          if ((p_Var13 == (__node_base_ptr)0x0) || (p_Var13->_M_nxt == (_Hash_node_base *)0x0)) {
            if (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_108._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<mir::inst::VarId,std::allocator<mir::inst::VarId>>::
              _M_push_back_aux<mir::inst::VarId_const&>
                        ((deque<mir::inst::VarId,std::allocator<mir::inst::VarId>> *)&local_108,
                         pVVar1);
            }
            else {
              ((local_108._M_impl.super__Deque_impl_data._M_finish._M_cur)->super_Displayable).
              _vptr_Displayable = (_func_int **)&PTR_display_001eb100;
              (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur)->id =
                   *(uint32_t *)
                    ((long)&((_Var12._M_cur)->
                            super__Hash_node_value<std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_true>
                            ).
                            super__Hash_node_value_base<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>
                            ._M_storage._M_storage + 0x18);
              local_108._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_108._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
            }
          }
        }
        p_Var13 = std::
                  _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                  ::_M_find_before_node
                            (local_88,(ulong)local_118.id %
                                      (local_b0->backup_ref_vars)._M_h._M_bucket_count,&local_118,
                             (ulong)local_118.id);
        bVar15 = pVar17.second | bVar15;
        if ((p_Var13 != (__node_base_ptr)0x0) && (p_Var13->_M_nxt != (_Hash_node_base *)0x0)) {
          local_120 = local_90;
          pVar17 = std::
                   _Hashtable<mir::inst::VarId,mir::inst::VarId,std::allocator<mir::inst::VarId>,std::__detail::_Identity,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                   ::
                   _M_insert<mir::inst::VarId_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<mir::inst::VarId,true>>>>
                             ((_Hashtable<mir::inst::VarId,mir::inst::VarId,std::allocator<mir::inst::VarId>,std::__detail::_Identity,std::equal_to<mir::inst::VarId>,std::hash<mir::inst::VarId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                               *)local_90,&local_118,&local_120);
          bVar15 = bVar15 | pVar17.second;
        }
      } while (local_108._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_108._M_impl.super__Deque_impl_data._M_start._M_cur);
    }
    pVVar10 = local_108._M_impl.super__Deque_impl_data._M_start._M_first;
    pVVar11 = local_108._M_impl.super__Deque_impl_data._M_start._M_last;
    pVVar3 = local_108._M_impl.super__Deque_impl_data._M_start._M_cur;
    ppVVar4 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
    ppVVar5 = local_108._M_impl.super__Deque_impl_data._M_start._M_node;
    ppVVar6 = local_108._M_impl.super__Deque_impl_data._M_finish._M_node;
  } while ((bVar15 & 1) != 0);
  std::
  _Hashtable<mir::inst::VarId,_mir::inst::VarId,_std::allocator<mir::inst::VarId>,_std::__detail::_Identity,_std::equal_to<mir::inst::VarId>,_std::hash<mir::inst::VarId>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_68);
  std::_Deque_base<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~_Deque_base(&local_108);
  return;
}

Assistant:

void ComplexDceRunner::calc_remained_vars() {
  // Add all stored variables to root vars
  std::deque<VarId> remaining;
  std::unordered_set<VarId> visited;

  bool changed = true;

  while (changed) {
    changed = false;

    remaining.clear();
    for (auto x : ref_vars) remaining.push_back(x);
    while (!remaining.empty()) {
      auto v = remaining.front();
      remaining.pop_front();
      visited.insert(v);
      for (auto [it, end] = invert_dependance.equal_range(v); it != end; it++) {
        if (visited.find(it->second) == visited.end()) {
          remaining.push_back(it->second);
        }
      }
      for (auto [it, end] = store_dependance.equal_range(v); it != end; it++) {
        changed |= do_not_delete.insert(it->second).second;
        changed |= do_not_delete.insert(v).second;
      }
    }

    // Add all dependant of root vars
    remaining.clear();
    for (auto x : do_not_delete) remaining.push_back(x);
    while (!remaining.empty()) {
      auto v = remaining.front();
      remaining.pop_front();
      changed |= do_not_delete.insert(v).second;
      for (auto [it, end] = var_dependance.equal_range(v); it != end; it++) {
        if (do_not_delete.find(it->second) == do_not_delete.end()) {
          remaining.push_back(it->second);
        }
      }
      if (backup_ref_vars.find(v) != backup_ref_vars.end()) {
        changed |= ref_vars.insert(v).second;
      }
    }
  }
}